

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMesh.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChMesh::IntStateScatterAcceleration(ChMesh *this,uint off_a,ChStateDelta *a)

{
  pointer psVar1;
  element_type *peVar2;
  long lVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  
  iVar6 = 0;
  uVar7 = 0;
  while( true ) {
    psVar1 = (this->vnodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = (ulong)uVar7;
    if ((ulong)((long)(this->vnodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= uVar8)
    break;
    cVar4 = (**(code **)((long)(psVar1[uVar8].
                                super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ChNodeFEAbase + 0x18))();
    if (cVar4 == '\0') {
      peVar2 = (this->vnodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].
               super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      lVar3 = *(long *)((long)peVar2->_vptr_ChNodeFEAbase + -0x18);
      (**(code **)(*(long *)((long)&peVar2->_vptr_ChNodeFEAbase + lVar3) + 0x38))
                ((long)&peVar2->_vptr_ChNodeFEAbase + lVar3,iVar6 + off_a,a);
      peVar2 = (this->vnodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].
               super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      lVar3 = *(long *)((long)peVar2->_vptr_ChNodeFEAbase + -0x18);
      iVar5 = (**(code **)(*(long *)((long)&peVar2->_vptr_ChNodeFEAbase + lVar3) + 0x18))
                        ((long)&peVar2->_vptr_ChNodeFEAbase + lVar3);
      iVar6 = iVar5 + iVar6;
    }
    uVar7 = uVar7 + 1;
  }
  return;
}

Assistant:

void ChMesh::IntStateScatterAcceleration(const unsigned int off_a, const ChStateDelta& a) {
    unsigned int local_off_a = 0;
    for (unsigned int j = 0; j < vnodes.size(); j++) {
        if (!vnodes[j]->GetFixed()) {
            vnodes[j]->NodeIntStateScatterAcceleration(off_a + local_off_a, a);
            local_off_a += vnodes[j]->Get_ndof_w();
        }
    }
}